

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase58::run(TestCase58 *this)

{
  Builder builder_00;
  Reader reader;
  Reader reader_00;
  Builder builder_01;
  Builder root;
  MallocMessageBuilder builder;
  StructBuilder local_208;
  undefined8 local_1e0;
  SegmentBuilder *pSStack_1d8;
  WirePointer *pWStack_1d0;
  void *pvStack_1c8;
  WirePointer *pWStack_1c0;
  StructDataBitCount local_1b8;
  StructPointerCount SStack_1b4;
  undefined2 uStack_1b2;
  undefined8 local_1b0;
  SegmentBuilder *pSStack_1a8;
  CapTableBuilder *pCStack_1a0;
  WirePointer *pWStack_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined1 local_178 [16];
  WirePointer *local_168;
  void *pvStack_160;
  WirePointer *local_158;
  undefined8 uStack_150;
  Builder local_148;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  undefined8 uStack_108;
  undefined8 local_100;
  MallocMessageBuilder local_f8;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_f8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal(&local_148,&local_f8.super_MessageBuilder);
  local_168 = local_148.builder.pointer;
  local_178._0_8_ = local_148.builder.segment;
  local_178._8_8_ = local_148.builder.capTable;
  PointerBuilder::initStruct(&local_208,(PointerBuilder *)local_178,(StructSize)0x140006);
  builder_01._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffed8;
  builder_01._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffed0;
  builder_01._builder.data = (void *)in_stack_fffffffffffffee0;
  builder_01._builder.pointers = (WirePointer *)in_stack_fffffffffffffee8;
  builder_01._builder.dataSize = (int)in_stack_fffffffffffffef0;
  builder_01._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  builder_01._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffef0 >> 0x30);
  initTestMessage(builder_01);
  StructBuilder::asReader(&local_208);
  local_188 = local_158;
  uStack_180 = uStack_150;
  pWStack_198 = local_168;
  uStack_190 = pvStack_160;
  pSStack_1a8 = (SegmentBuilder *)local_178._0_8_;
  pCStack_1a0 = (CapTableBuilder *)local_178._8_8_;
  local_1b0 = 0x613328;
  reader.reader.segment = (SegmentReader *)local_178._0_8_;
  reader.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x613328;
  reader.reader.capTable = (CapTableReader *)local_178._8_8_;
  reader.reader.data = local_168;
  reader.reader.pointers = (WirePointer *)pvStack_160;
  reader.reader._32_8_ = local_158;
  reader.reader._40_8_ = uStack_150;
  checkDynamicTestMessage(reader);
  uStack_150._0_4_ = local_208.dataSize;
  uStack_150._4_2_ = local_208.pointerCount;
  uStack_150._6_2_ = local_208._38_2_;
  pvStack_160 = local_208.data;
  local_158 = local_208.pointers;
  local_178._8_8_ = local_208.segment;
  local_168 = (WirePointer *)local_208.capTable;
  local_178._0_8_ = schemas::s_a0a8f314b80b63fd + 0x48;
  StructBuilder::asReader((StructBuilder *)(local_178 + 8));
  reader_00.reader.segment = (SegmentReader *)in_stack_fffffffffffffed8;
  reader_00.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x613328;
  reader_00.reader.capTable = (CapTableReader *)in_stack_fffffffffffffee0;
  reader_00.reader.data = (void *)in_stack_fffffffffffffee8;
  reader_00.reader.pointers = (WirePointer *)in_stack_fffffffffffffef0;
  reader_00.reader._32_8_ = uStack_108;
  reader_00.reader._40_8_ = local_100;
  checkDynamicTestMessage(reader_00);
  pSStack_1d8 = local_208.segment;
  pWStack_1d0 = (WirePointer *)local_208.capTable;
  pvStack_1c8 = local_208.data;
  pWStack_1c0 = local_208.pointers;
  local_1b8 = local_208.dataSize;
  SStack_1b4 = local_208.pointerCount;
  uStack_1b2 = local_208._38_2_;
  local_1e0 = 0x613328;
  builder_00.builder.segment = local_208.segment;
  builder_00.schema.super_Schema.raw = (Schema)(RawBrandedSchema *)0x613328;
  builder_00.builder.capTable = local_208.capTable;
  builder_00.builder.data = local_208.data;
  builder_00.builder.pointers = local_208.pointers;
  builder_00.builder.dataSize = local_208.dataSize;
  builder_00.builder.pointerCount = local_208.pointerCount;
  builder_00.builder._38_2_ = local_208._38_2_;
  checkDynamicTestMessage(builder_00);
  MallocMessageBuilder::~MallocMessageBuilder(&local_f8);
  return;
}

Assistant:

TEST(DynamicApi, Read) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<TestAllTypes>();

  initTestMessage(root);

  checkDynamicTestMessage(toDynamic(root.asReader()));
  checkDynamicTestMessage(toDynamic(root).asReader());
  checkDynamicTestMessage(toDynamic(root));
}